

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLayeredRenderingBoundaryCondition.cpp
# Opt level: O3

void __thiscall
glcts::GeometryShaderLayeredRenderingBoundaryConditionNoGS::
GeometryShaderLayeredRenderingBoundaryConditionNoGS
          (GeometryShaderLayeredRenderingBoundaryConditionNoGS *this,Context *context,
          ExtParameters *extParams,char *name,char *description)

{
  pointer *ppTVar1;
  iterator __position;
  TextureInfo local_28;
  
  GeometryShaderLayeredRenderingBoundaryCondition::GeometryShaderLayeredRenderingBoundaryCondition
            (&this->super_GeometryShaderLayeredRenderingBoundaryCondition,context,extParams,name,
             description);
  (this->super_GeometryShaderLayeredRenderingBoundaryCondition).super_TestCaseBase.super_TestCase.
  super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__GeometryShaderLayeredRenderingBoundaryCondition_021101f8;
  local_28.m_depth = 4;
  local_28.m_draw_buffer = 0x8ce0;
  local_28.m_id = 0;
  local_28.m_texture_target = 0x806f;
  __position._M_current =
       (this->super_GeometryShaderLayeredRenderingBoundaryCondition).m_textures_info.
       super__Vector_base<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->super_GeometryShaderLayeredRenderingBoundaryCondition).m_textures_info.
      super__Vector_base<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>>
    ::_M_realloc_insert<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo_const&>
              ((vector<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>>
                *)&(this->super_GeometryShaderLayeredRenderingBoundaryCondition).m_textures_info,
               __position,&local_28);
  }
  else {
    (__position._M_current)->m_depth = 4;
    (__position._M_current)->m_draw_buffer = 0x8ce0;
    (__position._M_current)->m_id = 0;
    (__position._M_current)->m_texture_target = 0x806f;
    ppTVar1 = &(this->super_GeometryShaderLayeredRenderingBoundaryCondition).m_textures_info.
               super__Vector_base<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppTVar1 = *ppTVar1 + 1;
  }
  (this->super_GeometryShaderLayeredRenderingBoundaryCondition).m_draw_mode = 6;
  (this->super_GeometryShaderLayeredRenderingBoundaryCondition).m_n_points = 4;
  (this->super_GeometryShaderLayeredRenderingBoundaryCondition).m_is_fbo_layered = true;
  return;
}

Assistant:

GeometryShaderLayeredRenderingBoundaryConditionNoGS::GeometryShaderLayeredRenderingBoundaryConditionNoGS(
	Context& context, const ExtParameters& extParams, const char* name, const char* description)
	: GeometryShaderLayeredRenderingBoundaryCondition(context, extParams, name, description)
{
	TextureInfo texInfo;

	texInfo.m_depth			 = 4;
	texInfo.m_draw_buffer	= GL_COLOR_ATTACHMENT0;
	texInfo.m_id			 = 0;
	texInfo.m_texture_target = GL_TEXTURE_3D;

	m_textures_info.push_back(texInfo);

	m_draw_mode		 = GL_TRIANGLE_FAN;
	m_n_points		 = 4;
	m_is_fbo_layered = true;
}